

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *v,float v_speed,void *v_min,
                        void *v_max,char *format,float power)

{
  char cVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  uint uVar8;
  unsigned_long_long uVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  ulong uVar13;
  void *extraout_RDX;
  void *pvVar14;
  undefined7 uVar16;
  longlong v_00;
  undefined8 uVar15;
  longlong extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  unsigned_long_long extraout_RDX_03;
  uint uVar17;
  ImGuiDataType data_type_00;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ImVec2 IVar25;
  double dVar26;
  double dVar27;
  undefined4 uVar28;
  float fVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  double local_98;
  undefined8 local_88;
  float local_68;
  undefined8 local_58;
  
  pIVar5 = GImGui;
  pvVar14 = v;
  data_type_00 = data_type;
  if (GImGui->ActiveId == id) {
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      if (GImGui->NavActivatePressedId == id) {
        cVar1 = GImGui->ActiveIdIsJustActivated;
        goto joined_r0x00185122;
      }
    }
    else if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
      cVar1 = (GImGui->IO).MouseDown[0];
joined_r0x00185122:
      if (cVar1 == '\0') {
        ClearActiveID();
        pvVar14 = extraout_RDX;
      }
    }
  }
  pIVar6 = GImGui;
  if (pIVar5->ActiveId != id) {
    return false;
  }
  uVar16 = (undefined7)((ulong)pvVar14 >> 8);
  switch(data_type) {
  case 0:
    if (v_min == (void *)0x0) {
      uVar18 = 0x80000000;
    }
    else {
      uVar18 = *v_min;
    }
    if (v_max == (void *)0x0) {
      uVar17 = 0x7fffffff;
    }
    else {
      uVar17 = *v_max;
    }
    fVar24 = 0.0;
    uVar15 = CONCAT71(uVar16,NAN(v_speed));
    if (v_speed == 0.0 && uVar17 - uVar18 != 0) {
      v_speed = (float)(int)(uVar17 - uVar18) * GImGui->DragSpeedDefaultRatio;
    }
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar25 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar24 = IVar25.x;
      uVar15 = extraout_RDX_01;
      if (v_speed <= 1.0) {
        v_speed = 1.0;
      }
    }
    else if ((((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
              (-256000.0 <= (GImGui->IO).MousePos.x)) && (-256000.0 <= (GImGui->IO).MousePos.y)) &&
            (1.0 < (GImGui->IO).MouseDragMaxDistanceSqr[0])) {
      fVar24 = (GImGui->IO).MouseDelta.x;
      if ((GImGui->IO).KeyAlt != false) {
        fVar24 = fVar24 * 0.01;
      }
      if ((GImGui->IO).KeyShift == true) {
        fVar24 = fVar24 * 10.0;
      }
    }
    iVar7 = (int)uVar15;
    fVar24 = fVar24 * v_speed;
    if (uVar17 == uVar18) {
      bVar11 = false;
    }
    else {
      iVar2 = *v;
      if (((int)uVar17 <= iVar2) && (0.0 < fVar24)) goto LAB_001859c1;
      iVar7 = (int)CONCAT71((int7)((ulong)uVar15 >> 8),iVar2 <= (int)uVar18);
      bVar11 = fVar24 < 0.0 && iVar2 <= (int)uVar18;
    }
    if ((pIVar6->ActiveIdIsJustActivated != false) || (bVar11)) goto LAB_001859c1;
    if ((fVar24 != 0.0) || (NAN(fVar24))) {
      fVar23 = pIVar6->DragCurrentAccum + fVar24;
      pIVar6->DragCurrentAccum = fVar23;
      pIVar6->DragCurrentAccumDirty = true;
    }
    else {
      if ((pIVar6->DragCurrentAccumDirty & 1U) == 0) {
        return false;
      }
      fVar23 = pIVar6->DragCurrentAccum;
    }
    uVar8 = RoundScalarWithFormat<int,int>(format,(int)fVar23 + *v,iVar7);
    pIVar6->DragCurrentAccumDirty = false;
    uVar12 = *v;
    pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - (float)(int)(uVar8 - uVar12);
    if ((uVar17 == uVar18) || (uVar8 == uVar12)) goto LAB_00186050;
    if (((int)uVar8 < (int)uVar18) || (((int)uVar12 < (int)uVar8 && (fVar24 < 0.0)))) {
      uVar8 = uVar18;
    }
    if ((int)uVar8 <= (int)uVar17) {
      if ((int)uVar12 <= (int)uVar8) goto LAB_00186050;
LAB_00186046:
      if (fVar24 <= 0.0) goto LAB_00186050;
    }
    goto LAB_0018604e;
  case 1:
    if (v_min == (void *)0x0) {
      uVar18 = 0;
    }
    else {
      uVar18 = *v_min;
    }
    if (v_max == (void *)0x0) {
      uVar17 = 0xffffffff;
    }
    else {
      uVar17 = *v_max;
    }
    fVar24 = 0.0;
    uVar15 = CONCAT71(uVar16,NAN(v_speed));
    if (v_speed == 0.0 && uVar17 - uVar18 != 0) {
      v_speed = (float)(uVar17 - uVar18) * GImGui->DragSpeedDefaultRatio;
    }
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar25 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar24 = IVar25.x;
      uVar15 = extraout_RDX_02;
      if (v_speed <= 1.0) {
        v_speed = 1.0;
      }
    }
    else if ((((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
              (-256000.0 <= (GImGui->IO).MousePos.x)) && (-256000.0 <= (GImGui->IO).MousePos.y)) &&
            (1.0 < (GImGui->IO).MouseDragMaxDistanceSqr[0])) {
      fVar24 = (GImGui->IO).MouseDelta.x;
      if ((GImGui->IO).KeyAlt != false) {
        fVar24 = fVar24 * 0.01;
      }
      if ((GImGui->IO).KeyShift == true) {
        fVar24 = fVar24 * 10.0;
      }
    }
    uVar12 = (uint)uVar15;
    fVar24 = fVar24 * v_speed;
    if (uVar17 == uVar18) {
      bVar11 = false;
    }
    else {
      uVar8 = *v;
      if ((uVar17 <= uVar8) && (0.0 < fVar24)) goto LAB_001859c1;
      uVar12 = (uint)CONCAT71((int7)((ulong)uVar15 >> 8),uVar8 <= uVar18);
      bVar11 = fVar24 < 0.0 && uVar8 <= uVar18;
    }
    if ((pIVar6->ActiveIdIsJustActivated != false) || (bVar11)) goto LAB_001859c1;
    if ((fVar24 != 0.0) || (NAN(fVar24))) {
      fVar23 = pIVar6->DragCurrentAccum + fVar24;
      pIVar6->DragCurrentAccum = fVar23;
      pIVar6->DragCurrentAccumDirty = true;
    }
    else {
      if ((pIVar6->DragCurrentAccumDirty & 1U) == 0) {
        return false;
      }
      fVar23 = pIVar6->DragCurrentAccum;
    }
    uVar8 = RoundScalarWithFormat<unsigned_int,int>(format,(int)(long)fVar23 + *v,uVar12);
    pIVar6->DragCurrentAccumDirty = false;
    uVar12 = *v;
    pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - (float)(int)(uVar8 - uVar12);
    if ((uVar17 == uVar18) || (uVar8 == uVar12)) goto LAB_00186050;
    if ((uVar8 < uVar18) || ((uVar12 < uVar8 && (fVar24 < 0.0)))) {
      uVar8 = uVar18;
    }
    if (uVar8 <= uVar17) {
      if (uVar12 <= uVar8) goto LAB_00186050;
      goto LAB_00186046;
    }
LAB_0018604e:
    uVar8 = uVar17;
LAB_00186050:
    if (uVar12 != uVar8) {
      *(uint *)v = uVar8;
      return true;
    }
    return false;
  case 2:
    uVar20 = 0x7fffffffffffffff;
    if (v_min == (void *)0x0) {
      uVar19 = 0x8000000000000000;
    }
    else {
      uVar19 = *v_min;
    }
    if (v_max != (void *)0x0) {
      uVar20 = *v_max;
    }
    fVar24 = 0.0;
    v_00 = CONCAT71(uVar16,NAN(v_speed));
    if (v_speed == 0.0 && uVar20 - uVar19 != 0) {
      v_speed = (float)(long)(uVar20 - uVar19) * GImGui->DragSpeedDefaultRatio;
    }
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar25 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar24 = IVar25.x;
      v_00 = extraout_RDX_00;
      if (v_speed <= 1.0) {
        v_speed = 1.0;
      }
    }
    else if ((((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
              (-256000.0 <= (GImGui->IO).MousePos.x)) && (-256000.0 <= (GImGui->IO).MousePos.y)) &&
            (1.0 < (GImGui->IO).MouseDragMaxDistanceSqr[0])) {
      fVar24 = (GImGui->IO).MouseDelta.x;
      if ((GImGui->IO).KeyAlt != false) {
        fVar24 = fVar24 * 0.01;
      }
      if ((GImGui->IO).KeyShift == true) {
        fVar24 = fVar24 * 10.0;
      }
    }
    fVar24 = fVar24 * v_speed;
    if (uVar20 == uVar19) {
      bVar11 = false;
    }
    else {
      lVar3 = *v;
      if (((long)uVar20 <= lVar3) && (0.0 < fVar24)) goto LAB_001859c1;
      v_00 = CONCAT71((int7)((ulong)v_00 >> 8),lVar3 <= (long)uVar19);
      bVar11 = fVar24 < 0.0 && lVar3 <= (long)uVar19;
    }
    if ((pIVar6->ActiveIdIsJustActivated == false) && (!bVar11)) {
      if ((fVar24 != 0.0) || (NAN(fVar24))) {
        fVar23 = pIVar6->DragCurrentAccum + fVar24;
        pIVar6->DragCurrentAccum = fVar23;
        pIVar6->DragCurrentAccumDirty = true;
      }
      else {
        if ((pIVar6->DragCurrentAccumDirty & 1U) == 0) {
          return false;
        }
        fVar23 = pIVar6->DragCurrentAccum;
      }
      uVar9 = RoundScalarWithFormat<long_long,long_long>(format,(int)(long)fVar23 + (int)*v,v_00);
      pIVar6->DragCurrentAccumDirty = false;
      uVar13 = *v;
      pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - (float)(long)(uVar9 - uVar13);
      if ((uVar20 != uVar19) && (uVar9 != uVar13)) {
        if (((long)uVar9 < (long)uVar19) || (((long)uVar13 < (long)uVar9 && (fVar24 < 0.0)))) {
          uVar9 = uVar19;
        }
        if (((long)uVar20 < (long)uVar9) || (((long)uVar9 < (long)uVar13 && (0.0 < fVar24)))) {
          uVar9 = uVar20;
        }
      }
LAB_00185f2b:
      if (uVar13 == uVar9) {
        return false;
      }
      *(unsigned_long_long *)v = uVar9;
      return true;
    }
LAB_001859c1:
    pIVar6->DragCurrentAccum = 0.0;
    pIVar6->DragCurrentAccumDirty = false;
    return false;
  case 3:
    if (v_min == (void *)0x0) {
      uVar20 = 0;
    }
    else {
      uVar20 = *v_min;
    }
    if (v_max == (void *)0x0) {
      uVar19 = 0xffffffffffffffff;
    }
    else {
      uVar19 = *v_max;
    }
    fVar24 = 0.0;
    uVar9 = CONCAT71(uVar16,NAN(v_speed));
    if (v_speed == 0.0 && uVar19 - uVar20 != 0) {
      v_speed = (float)(uVar19 - uVar20) * GImGui->DragSpeedDefaultRatio;
    }
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar25 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar24 = IVar25.x;
      uVar9 = extraout_RDX_03;
      if (v_speed <= 1.0) {
        v_speed = 1.0;
      }
    }
    else if ((((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
              (-256000.0 <= (GImGui->IO).MousePos.x)) && (-256000.0 <= (GImGui->IO).MousePos.y)) &&
            (1.0 < (GImGui->IO).MouseDragMaxDistanceSqr[0])) {
      fVar24 = (GImGui->IO).MouseDelta.x;
      if ((GImGui->IO).KeyAlt != false) {
        fVar24 = fVar24 * 0.01;
      }
      if ((GImGui->IO).KeyShift == true) {
        fVar24 = fVar24 * 10.0;
      }
    }
    fVar24 = fVar24 * v_speed;
    if (uVar19 == uVar20) {
      bVar11 = false;
    }
    else {
      uVar13 = *v;
      if ((uVar19 <= uVar13) && (0.0 < fVar24)) break;
      uVar9 = CONCAT71((int7)(uVar9 >> 8),uVar13 <= uVar20);
      bVar11 = fVar24 < 0.0 && uVar13 <= uVar20;
    }
    if ((pIVar6->ActiveIdIsJustActivated == false) && (!bVar11)) {
      if ((fVar24 != 0.0) || (NAN(fVar24))) {
        fVar23 = pIVar6->DragCurrentAccum + fVar24;
        pIVar6->DragCurrentAccum = fVar23;
        pIVar6->DragCurrentAccumDirty = true;
      }
      else {
        if ((pIVar6->DragCurrentAccumDirty & 1U) == 0) {
          return false;
        }
        fVar23 = pIVar6->DragCurrentAccum;
      }
      uVar9 = RoundScalarWithFormat<unsigned_long_long,long_long>
                        (format,((uint)(long)(fVar23 - 9.223372e+18) & (uint)((long)fVar23 >> 0x3f)
                                | (uint)(long)fVar23) + (int)*v,uVar9);
      pIVar6->DragCurrentAccumDirty = false;
      uVar13 = *v;
      pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - (float)(long)(uVar9 - uVar13);
      if ((uVar19 != uVar20) && (uVar9 != uVar13)) {
        if ((uVar9 < uVar20) || ((uVar13 < uVar9 && (fVar24 < 0.0)))) {
          uVar9 = uVar20;
        }
        if ((uVar19 < uVar9) || ((uVar9 < uVar13 && (0.0 < fVar24)))) {
          uVar9 = uVar19;
        }
      }
      goto LAB_00185f2b;
    }
    break;
  case 4:
    if (v_min == (void *)0x0) {
      fVar24 = -3.4028235e+38;
    }
    else {
      fVar24 = *v_min;
    }
    if (v_max == (void *)0x0) {
      fVar23 = 3.4028235e+38;
    }
    else {
      fVar23 = *v_max;
    }
    bVar11 = fVar24 != fVar23;
    bVar4 = fVar23 - fVar23 < 3.4028235e+38;
    local_68 = 0.0;
    if (((v_speed == 0.0) && (!NAN(v_speed))) && (bVar4 && bVar11)) {
      v_speed = (fVar23 - fVar24) * GImGui->DragSpeedDefaultRatio;
    }
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      iVar7 = ImParseFormatPrecision(format,3);
      data_type_00 = 5;
      IVar25 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar21 = GetMinimumStepAtDecimalPrecision(iVar7);
      local_68 = IVar25.x;
      v_speed = (float)(-(uint)(fVar21 <= v_speed) & (uint)v_speed |
                       ~-(uint)(fVar21 <= v_speed) & (uint)fVar21);
    }
    else if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
             (-256000.0 <= (GImGui->IO).MousePos.x)) &&
            ((-256000.0 <= (GImGui->IO).MousePos.y &&
             (1.0 < (GImGui->IO).MouseDragMaxDistanceSqr[0])))) {
      local_68 = (GImGui->IO).MouseDelta.x;
      if ((GImGui->IO).KeyAlt != false) {
        local_68 = local_68 * 0.01;
      }
      if ((GImGui->IO).KeyShift == true) {
        local_68 = local_68 * 10.0;
      }
    }
    local_68 = local_68 * v_speed;
    if (bVar4 && bVar11) {
      if ((fVar23 <= *v) && (0.0 < local_68)) break;
      bVar10 = local_68 < 0.0 && *v <= fVar24;
    }
    else {
      bVar10 = false;
    }
    if ((pIVar6->ActiveIdIsJustActivated == false) && (!bVar10)) {
      if ((local_68 != 0.0) || (NAN(local_68))) {
        pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum + local_68;
        pIVar6->DragCurrentAccumDirty = true;
      }
      else if ((pIVar6->DragCurrentAccumDirty & 1U) == 0) {
        return false;
      }
      if (power != 1.0 && (bVar4 && bVar11)) {
        fVar29 = fVar23 - fVar24;
        local_98._0_4_ = powf((*v - fVar24) / fVar29,1.0 / power);
        fVar22 = local_98._0_4_ + pIVar6->DragCurrentAccum / fVar29;
        fVar21 = 1.0;
        if (fVar22 <= 1.0) {
          fVar21 = fVar22;
        }
        fVar21 = powf((float)(~-(uint)(fVar22 < 0.0) & (uint)fVar21),power);
        fVar21 = fVar21 * fVar29 + fVar24;
      }
      else {
        fVar21 = *v + pIVar6->DragCurrentAccum;
        local_98._0_4_ = 0.0;
      }
      fVar21 = RoundScalarWithFormat<float,float>(format,data_type_00,fVar21);
      pIVar6->DragCurrentAccumDirty = false;
      if (power != 1.0 && (bVar4 && bVar11)) {
        fVar22 = powf((fVar21 - fVar24) / (fVar23 - fVar24),1.0 / power);
        fVar22 = fVar22 - local_98._0_4_;
      }
      else {
        fVar22 = fVar21 - *v;
      }
      pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - fVar22;
      fVar21 = (float)(~-(uint)(fVar21 == 0.0) & (uint)fVar21);
      fVar22 = *v;
      if ((bVar4 && bVar11) && fVar21 != fVar22) {
        if ((fVar21 < fVar24) || ((fVar22 < fVar21 && (local_68 < 0.0)))) {
          fVar21 = fVar24;
        }
        if ((fVar23 < fVar21) || ((fVar21 < fVar22 && (0.0 < local_68)))) {
          fVar21 = fVar23;
        }
      }
      if ((fVar22 == fVar21) && (!NAN(fVar22) && !NAN(fVar21))) {
        return false;
      }
      *(float *)v = fVar21;
      return true;
    }
    break;
  case 5:
    if (v_min == (void *)0x0) {
      uVar31 = 0xffffffff;
      uVar32 = 0xffefffff;
    }
    else {
      uVar31 = (undefined4)*v_min;
      uVar32 = (undefined4)((ulong)*v_min >> 0x20);
    }
    if (v_max == (void *)0x0) {
      uVar28 = 0xffffffff;
      uVar30 = 0x7fefffff;
    }
    else {
      uVar28 = (undefined4)*v_max;
      uVar30 = (undefined4)((ulong)*v_max >> 0x20);
    }
    bVar11 = (double)CONCAT44(uVar32,uVar31) != (double)CONCAT44(uVar30,uVar28);
    bVar4 = (double)CONCAT44(uVar30,uVar28) - (double)CONCAT44(uVar30,uVar28) <
            3.4028234663852886e+38;
    local_68 = 0.0;
    if (((v_speed == 0.0) && (!NAN(v_speed))) && (bVar4 && bVar11)) {
      v_speed = (float)((double)GImGui->DragSpeedDefaultRatio *
                       ((double)CONCAT44(uVar30,uVar28) - (double)CONCAT44(uVar32,uVar31)));
    }
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      iVar7 = ImParseFormatPrecision(format,3);
      data_type_00 = 5;
      IVar25 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar24 = GetMinimumStepAtDecimalPrecision(iVar7);
      local_68 = IVar25.x;
      v_speed = (float)(-(uint)(fVar24 <= v_speed) & (uint)v_speed |
                       ~-(uint)(fVar24 <= v_speed) & (uint)fVar24);
    }
    else if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
             (-256000.0 <= (GImGui->IO).MousePos.x)) &&
            ((-256000.0 <= (GImGui->IO).MousePos.y &&
             (1.0 < (GImGui->IO).MouseDragMaxDistanceSqr[0])))) {
      local_68 = (GImGui->IO).MouseDelta.x;
      if ((GImGui->IO).KeyAlt != false) {
        local_68 = local_68 * 0.01;
      }
      if ((GImGui->IO).KeyShift == true) {
        local_68 = local_68 * 10.0;
      }
    }
    local_68 = local_68 * v_speed;
    if (bVar4 && bVar11) {
      if (((double)CONCAT44(uVar30,uVar28) <= *v) && (0.0 < local_68)) break;
      bVar10 = local_68 < 0.0 && *v <= (double)CONCAT44(uVar32,uVar31);
    }
    else {
      bVar10 = false;
    }
    if ((pIVar6->ActiveIdIsJustActivated == false) && (!bVar10)) {
      if ((local_68 != 0.0) || (NAN(local_68))) {
        pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum + local_68;
        pIVar6->DragCurrentAccumDirty = true;
      }
      else if ((pIVar6->DragCurrentAccumDirty & 1U) == 0) {
        return false;
      }
      local_58 = (double)CONCAT44(uVar30,uVar28);
      local_88 = (double)CONCAT44(uVar32,uVar31);
      if (power != 1.0 && (bVar4 && bVar11)) {
        dVar26 = (double)CONCAT44(uVar30,uVar28) - (double)CONCAT44(uVar32,uVar31);
        local_98 = pow((*v - (double)CONCAT44(uVar32,uVar31)) / dVar26,1.0 / (double)power);
        fVar23 = (float)((double)pIVar6->DragCurrentAccum / dVar26 + local_98);
        fVar24 = 1.0;
        if (fVar23 <= 1.0) {
          fVar24 = fVar23;
        }
        fVar24 = powf((float)(~-(uint)(fVar23 < 0.0) & (uint)fVar24),power);
        dVar26 = (double)fVar24 * dVar26 + local_88;
      }
      else {
        dVar26 = *v + (double)pIVar6->DragCurrentAccum;
        local_98 = 0.0;
      }
      dVar26 = RoundScalarWithFormat<double,double>(format,data_type_00,dVar26);
      pIVar6->DragCurrentAccumDirty = false;
      if (power != 1.0 && (bVar4 && bVar11)) {
        dVar27 = pow((dVar26 - local_88) / (local_58 - local_88),1.0 / (double)power);
        pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - (float)(dVar27 - local_98);
        dVar27 = *v;
      }
      else {
        dVar27 = *v;
        pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - (float)(dVar26 - dVar27);
      }
      dVar26 = (double)(~-(ulong)(dVar26 == 0.0) & (ulong)dVar26);
      if ((bVar4 && bVar11) && dVar27 != dVar26) {
        if ((dVar26 < local_88) || ((dVar27 < dVar26 && (local_68 < 0.0)))) {
          dVar26 = local_88;
        }
        if ((local_58 < dVar26) || ((dVar26 < dVar27 && (0.0 < local_68)))) {
          dVar26 = local_58;
        }
      }
      if ((dVar27 == dVar26) && (!NAN(dVar27) && !NAN(dVar26))) {
        return false;
      }
      *(double *)v = dVar26;
      return true;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x24c0,
                  "bool ImGui::DragBehavior(ImGuiID, ImGuiDataType, void *, float, const void *, const void *, const char *, float)"
                 );
  }
  pIVar6->DragCurrentAccum = 0.0;
  pIVar6->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* v, float v_speed, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)v,  v_speed, v_min ? *(const ImS32* )v_min : IM_S32_MIN, v_max ? *(const ImS32* )v_max : IM_S32_MAX, format, power);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)v,  v_speed, v_min ? *(const ImU32* )v_min : IM_U32_MIN, v_max ? *(const ImU32* )v_max : IM_U32_MAX, format, power);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)v,  v_speed, v_min ? *(const ImS64* )v_min : IM_S64_MIN, v_max ? *(const ImS64* )v_max : IM_S64_MAX, format, power);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)v,  v_speed, v_min ? *(const ImU64* )v_min : IM_U64_MIN, v_max ? *(const ImU64* )v_max : IM_U64_MAX, format, power);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)v,  v_speed, v_min ? *(const float* )v_min : -FLT_MAX,   v_max ? *(const float* )v_max : FLT_MAX,    format, power);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)v, v_speed, v_min ? *(const double*)v_min : -DBL_MAX,   v_max ? *(const double*)v_max : DBL_MAX,    format, power);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}